

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<char>::write<std::__cxx11::string,std::__cxx11::string,char[100],char_const*>
          (BasicWriter<char> *this,BasicCStringRef<char> arg0,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [100],char **args_3)

{
  pointer local_48;
  size_type sStack_40;
  pointer local_38;
  size_type sStack_30;
  char (*local_28) [100];
  char *local_18;
  
  local_48 = (args->_M_dataplus)._M_p;
  sStack_40 = args->_M_string_length;
  local_38 = (args_1->_M_dataplus)._M_p;
  sStack_30 = args_1->_M_string_length;
  local_18 = *args_3;
  local_28 = args_2;
  write(this,(int)arg0.data_,(void *)0xaabb,(size_t)&local_48);
  return;
}

Assistant:

BasicWriter &operator<<(int value)
    {
        write_decimal(value);
        return *this;
    }